

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

either * toml::detail::syntax::basic_char(either *__return_storage_ptr__,spec *s)

{
  anon_class_8_1_54a39813 basic_unescaped;
  sequence sStack_58;
  either local_38;
  anon_class_8_1_54a39813 local_18;
  
  local_18.s = s;
  basic_char::anon_class_8_1_54a39813::operator()(&local_38,&local_18);
  escaped(&sStack_58,s);
  either::either<toml::detail::either,toml::detail::sequence>
            (__return_storage_ptr__,&local_38,&sStack_58);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&sStack_58.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_38.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE either basic_char(const spec& s)
{
    const auto basic_unescaped = [&s]() {
        return either(
                wschar(s),
                character(0x21),                // 22 is "
                character_in_range(0x23, 0x5B), // 5C is backslash
                character_in_range(0x5D, 0x7E), // 7F is DEL
                non_ascii(s)
            );
    };
    return either(basic_unescaped(), escaped(s));
}